

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_flush(int flush_opts)

{
  Channel channel;
  Caliper c;
  undefined1 local_48 [48];
  
  cali::Caliper::Caliper((Caliper *)(local_48 + 0x10));
  cali::Caliper::get_channel((Caliper *)local_48,(cali_id_t)(local_48 + 0x10));
  if (((GlobalData *)local_48._8_8_ != (GlobalData *)0x0) &&
     (0 < *(_Atomic_word *)(local_48._8_8_ + 8))) {
    cali::Caliper::flush_and_write
              ((Caliper *)(local_48 + 0x10),(ChannelBody *)local_48._0_8_,(SnapshotView)ZEXT816(0));
    if ((flush_opts & 1U) != 0) {
      cali::Caliper::clear((Caliper *)(local_48 + 0x10),(Channel *)local_48);
    }
  }
  cali::Channel::~Channel((Channel *)local_48);
  return;
}

Assistant:

void cali_flush(int flush_opts)
{
    Caliper c;
    Channel channel = c.get_channel(0); // channel 0 should be the default channel

    if (channel) {
        c.flush_and_write(channel.body(), SnapshotView());

        if (flush_opts & CALI_FLUSH_CLEAR_BUFFERS)
            c.clear(&channel);
    }
}